

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

void vkt::api::anon_unknown_0::createImageFormatTests
               (TestCaseGroup *testGroup,Function testFunction)

{
  TestContext *pTVar1;
  ImageFormatPropertyCase arg0;
  ImageFormatPropertyCase arg0_00;
  ImageFormatPropertyCase arg0_01;
  TestNode *pTVar2;
  allocator<char> local_a2;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  Function local_60;
  undefined8 uStack_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  Function local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 uStack_34;
  Function local_30;
  undefined8 uStack_28;
  undefined4 local_20;
  undefined4 uStack_1c;
  
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"1d",&local_a1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a2);
  uStack_28 = 0;
  local_20 = 2;
  arg0._20_4_ = uStack_1c;
  arg0.tiling = 2;
  arg0.format = VK_FORMAT_UNDEFINED;
  arg0.imageType = VK_IMAGE_TYPE_1D;
  arg0.testFunction = testFunction;
  local_30 = testFunction;
  pTVar2 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar1,&local_80,&local_a0,createImageFormatTypeTests,arg0)->super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"2d",&local_a1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a2);
  uStack_40 = 0x100000000;
  local_38 = 2;
  arg0_00._20_4_ = uStack_34;
  arg0_00.tiling = 2;
  arg0_00.format = VK_FORMAT_UNDEFINED;
  arg0_00.imageType = VK_IMAGE_TYPE_2D;
  arg0_00.testFunction = testFunction;
  local_48 = testFunction;
  pTVar2 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar1,&local_80,&local_a0,createImageFormatTypeTests,arg0_00)->
            super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"3d",&local_a1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a2);
  uStack_58 = 0x200000000;
  local_50 = 2;
  arg0_01._20_4_ = uStack_4c;
  arg0_01.tiling = 2;
  arg0_01.format = VK_FORMAT_UNDEFINED;
  arg0_01.imageType = VK_IMAGE_TYPE_3D;
  arg0_01.testFunction = testFunction;
  local_60 = testFunction;
  pTVar2 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar1,&local_80,&local_a0,createImageFormatTypeTests,arg0_01)->
            super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void createImageFormatTests (tcu::TestCaseGroup* testGroup, ImageFormatPropertyCase::Function testFunction)
{
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "1d", "", createImageFormatTypeTests, ImageFormatPropertyCase(testFunction, VK_FORMAT_UNDEFINED, VK_IMAGE_TYPE_1D, VK_IMAGE_TILING_LAST)));
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "2d", "", createImageFormatTypeTests, ImageFormatPropertyCase(testFunction, VK_FORMAT_UNDEFINED, VK_IMAGE_TYPE_2D, VK_IMAGE_TILING_LAST)));
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "3d", "", createImageFormatTypeTests, ImageFormatPropertyCase(testFunction, VK_FORMAT_UNDEFINED, VK_IMAGE_TYPE_3D, VK_IMAGE_TILING_LAST)));
}